

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_eigenmath.h
# Opt level: O0

void __thiscall
SpatialMatrix_t::SpatialMatrix_t
          (SpatialMatrix_t *this,Scalar *m00,Scalar *m01,Scalar *m02,Scalar *m03,Scalar *m04,
          Scalar *m05,Scalar *m10,Scalar *m11,Scalar *m12,Scalar *m13,Scalar *m14,Scalar *m15,
          Scalar *m20,Scalar *m21,Scalar *m22,Scalar *m23,Scalar *m24,Scalar *m25,Scalar *m30,
          Scalar *m31,Scalar *m32,Scalar *m33,Scalar *m34,Scalar *m35,Scalar *m40,Scalar *m41,
          Scalar *m42,Scalar *m43,Scalar *m44,Scalar *m45,Scalar *m50,Scalar *m51,Scalar *m52,
          Scalar *m53,Scalar *m54,Scalar *m55)

{
  CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *this_00;
  CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *s;
  Scalar *in_stack_fffffffffffffe80;
  DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *in_stack_fffffffffffffe88;
  CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *in_stack_fffffffffffffe90;
  
  Eigen::Matrix<double,_6,_6,_0,_6,_6>::Matrix((Matrix<double,_6,_6,_0,_6,_6> *)0x6a6774);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::_check_template_params();
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator<<
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
            (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
                      (in_stack_fffffffffffffe90,(Scalar *)in_stack_fffffffffffffe88);
  s = Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_
                (this_00,(Scalar *)in_stack_fffffffffffffe88);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_(this_00,(Scalar *)s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::operator_(this_00,(Scalar *)s);
  Eigen::CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<double,_6,_6,_0,_6,_6>_> *)0x6a6b86);
  return;
}

Assistant:

EIGEN_STRONG_INLINE SpatialMatrix_t(
        const Scalar& m00, const Scalar& m01, const Scalar& m02, const Scalar& m03, const Scalar& m04, const Scalar& m05,
        const Scalar& m10, const Scalar& m11, const Scalar& m12, const Scalar& m13, const Scalar& m14, const Scalar& m15,
        const Scalar& m20, const Scalar& m21, const Scalar& m22, const Scalar& m23, const Scalar& m24, const Scalar& m25,
        const Scalar& m30, const Scalar& m31, const Scalar& m32, const Scalar& m33, const Scalar& m34, const Scalar& m35,
        const Scalar& m40, const Scalar& m41, const Scalar& m42, const Scalar& m43, const Scalar& m44, const Scalar& m45,
        const Scalar& m50, const Scalar& m51, const Scalar& m52, const Scalar& m53, const Scalar& m54, const Scalar& m55
        )
    {
      Base::_check_template_params();

      (*this)
        << m00, m01, m02, m03, m04, m05
        , m10, m11, m12, m13, m14, m15
        , m20, m21, m22, m23, m24, m25
        , m30, m31, m32, m33, m34, m35
        , m40, m41, m42, m43, m44, m45
        , m50, m51, m52, m53, m54, m55
        ;
    }